

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O3

void test_fun_obj(void)

{
  _Elt_pointer ptVar1;
  int iVar2;
  ostream *poVar3;
  test_context *scope;
  _Elt_pointer ptVar4;
  _Map_pointer pptVar5;
  _Elt_pointer ptVar6;
  _func_int_int *f;
  test_context local_60;
  char local_44 [4];
  code *local_40;
  undefined4 local_34;
  
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x1ec;
  local_60.expr = "test_invoke_fun(f(40), nothrows, f, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(f(40), nothrows, f, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x1ec);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x1ee;
  local_60.expr = "test_not_invocable(cf, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable(cf, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x1ee);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x1ef;
  local_60.expr = "test_invoke_fun(std::move(f)(40), nothrows, std::move(f), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(std::move(f)(40), nothrows, std::move(f), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x1ef);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x1f1;
  local_60.expr = "test_not_invocable(std::move(cf), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_not_invocable(std::move(cf), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x1f1);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 499;
  local_60.expr = "test_not_invocable(f)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable(f)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,499);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 500;
  local_60.expr = "test_not_invocable(f, 40, 41)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable(f, 40, 41)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,500);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x1f5;
  local_60.expr = "test_not_invocable_r<int*>(f, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable_r<int*>(f, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x1f5);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x201;
  local_60.expr = "test_invoke_fun(fc(40), nothrows, fc, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(fc(40), nothrows, fc, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x201);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x203;
  local_60.expr = "test_invoke_fun(cfc(40), nothrows, cfc, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(cfc(40), nothrows, cfc, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x203);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x205;
  local_60.expr = "test_invoke_fun(std::move(fc)(40), nothrows, std::move(fc), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(std::move(fc)(40), nothrows, std::move(fc), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x205);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x207;
  local_60.expr = "test_invoke_fun(std::move(cfc)(40), nothrows, std::move(cfc), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(std::move(cfc)(40), nothrows, std::move(cfc), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x207);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x214;
  local_60.expr = "test_invoke_fun(fl(40), nothrows, fl, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(fl(40), nothrows, fl, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x214);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x216;
  local_60.expr = "test_not_invocable(cfl, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable(cfl, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x216);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x217;
  local_60.expr = "test_not_invocable(std::move(fl), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_not_invocable(std::move(fl), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x217);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x218;
  local_60.expr = "test_not_invocable(std::move(cfl), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_not_invocable(std::move(cfl), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x218);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x224;
  local_60.expr = "test_not_invocable(fr, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable(fr, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x224);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x225;
  local_60.expr = "test_not_invocable(cfr, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable(cfr, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x225);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x226;
  local_60.expr = "test_invoke_fun(std::move(fr)(40), nothrows, std::move(fr), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(std::move(fr)(40), nothrows, std::move(fr), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x226);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x228;
  local_60.expr = "test_not_invocable(std::move(cfr), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_not_invocable(std::move(cfr), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x228);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x234;
  local_60.expr = "test_invoke_fun(fcl(40), nothrows, fcl, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(fcl(40), nothrows, fcl, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x234);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x236;
  local_60.expr = "test_invoke_fun(cfcl(40), nothrows, cfcl, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(cfcl(40), nothrows, cfcl, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x236);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x238;
  local_60.expr = "test_invoke_fun(std::move(fcl)(40), nothrows, std::move(fcl), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(std::move(fcl)(40), nothrows, std::move(fcl), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x238);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x23a;
  local_60.expr = "test_invoke_fun(std::move(cfcl)(40), nothrows, std::move(cfcl), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(std::move(cfcl)(40), nothrows, std::move(cfcl), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x23a);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x247;
  local_60.expr = "test_not_invocable(fcr, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable(fcr, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x247);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x248;
  local_60.expr = "test_not_invocable(cfcr, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable(cfcr, 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x248);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x249;
  local_60.expr = "test_invoke_fun(std::move(fcr)(40), nothrows, std::move(fcr), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(std::move(fcr)(40), nothrows, std::move(fcr), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x249);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x24b;
  local_60.expr = "test_invoke_fun(std::move(cfcr)(40), nothrows, std::move(cfcr), 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(std::move(cfcr)(40), nothrows, std::move(cfcr), 40)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x24b);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 8;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_40 = test_fun_obj::S::f;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x259;
  local_60.expr = "test_invoke_fun(f(40), p0012_nothrows, f, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(f(40), p0012_nothrows, f, 40)";
    *(undefined4 *)&ptVar1[-1].file = 0x113004;
    *(undefined4 *)((long)&ptVar1[-1].file + 4) = 0;
    ptVar1[-1].line = 0x259;
    *(undefined4 *)&ptVar1[-1].field_0xc = local_60._12_4_;
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  local_44[0] = '.';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  local_34 = 0x28;
  test_invoke_fun<int,true,int(*const&)(int)noexcept,int>(local_44,&local_40);
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  iVar2 = (*local_40)(0x28);
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x25a;
  local_60.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, 40))";
  if (iVar2 != 0x2e) {
    test_report_info<void>::failures = test_report_info<void>::failures + 1;
    poVar3 = operator<<((ostream *)&std::cerr,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is false\n",10);
    ptVar1 = test_scope_stack<void>::stack.
             super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur !=
        test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      ptVar4 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pptVar5 = test_scope_stack<void>::stack.
                super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      ptVar6 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
        poVar3 = operator<<((ostream *)&std::cerr,ptVar4);
        local_44[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_44,1);
        ptVar4 = ptVar4 + 1;
        if (ptVar4 == ptVar6) {
          ptVar4 = pptVar5[1];
          pptVar5 = pptVar5 + 1;
          ptVar6 = ptVar4 + 0x15;
        }
      } while (ptVar4 != ptVar1);
    }
    local_44[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_44,1);
  }
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x25c;
  local_60.expr = "test_invoke_fun(f(conv_to<int>{40}), p0012_nothrows, f, conv_to<int>{40})";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(f(conv_to<int>{40}), p0012_nothrows, f, conv_to<int>{40})";
    *(undefined4 *)&ptVar1[-1].file = 0x113004;
    *(undefined4 *)((long)&ptVar1[-1].file + 4) = 0;
    ptVar1[-1].line = 0x25c;
    *(undefined4 *)&ptVar1[-1].field_0xc = local_60._12_4_;
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  local_44[0] = '.';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  local_34 = 0x28;
  test_invoke_fun<int,true,int(*const&)(int)noexcept,conv_to<int,true>>(local_44,&local_40);
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  iVar2 = (*local_40)(0x28);
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x25d;
  local_60.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, conv_to<int>{40}))";
  if (iVar2 != 0x2e) {
    test_report_info<void>::failures = test_report_info<void>::failures + 1;
    poVar3 = operator<<((ostream *)&std::cerr,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is false\n",10);
    ptVar1 = test_scope_stack<void>::stack.
             super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur !=
        test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      ptVar4 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pptVar5 = test_scope_stack<void>::stack.
                super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      ptVar6 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
        poVar3 = operator<<((ostream *)&std::cerr,ptVar4);
        local_44[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_44,1);
        ptVar4 = ptVar4 + 1;
        if (ptVar4 == ptVar6) {
          ptVar4 = pptVar5[1];
          pptVar5 = pptVar5 + 1;
          ptVar6 = ptVar4 + 0x15;
        }
      } while (ptVar4 != ptVar1);
    }
    local_44[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_44,1);
  }
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x25e;
  local_60.expr = "test_invoke_fun(f(conv_to_throws<int>{40}), throws, f, conv_to_throws<int>{40})";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_fun(f(conv_to_throws<int>{40}), throws, f, conv_to_throws<int>{40})";
    *(undefined4 *)&ptVar1[-1].file = 0x113004;
    *(undefined4 *)((long)&ptVar1[-1].file + 4) = 0;
    ptVar1[-1].line = 0x25e;
    *(undefined4 *)&ptVar1[-1].field_0xc = local_60._12_4_;
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  local_44[0] = '.';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  local_34 = 0x28;
  test_invoke_fun<int,false,int(*const&)(int)noexcept,conv_to<int,false>>(local_44,&local_40);
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  iVar2 = (*local_40)(0x28);
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x25f;
  local_60.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, conv_to_throws<int>{40}))";
  if (iVar2 != 0x2e) {
    test_report_info<void>::failures = test_report_info<void>::failures + 1;
    poVar3 = operator<<((ostream *)&std::cerr,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is false\n",10);
    ptVar1 = test_scope_stack<void>::stack.
             super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur !=
        test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      ptVar4 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pptVar5 = test_scope_stack<void>::stack.
                super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      ptVar6 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
        poVar3 = operator<<((ostream *)&std::cerr,ptVar4);
        local_44[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_44,1);
        ptVar4 = ptVar4 + 1;
        if (ptVar4 == ptVar6) {
          ptVar4 = pptVar5[1];
          pptVar5 = pptVar5 + 1;
          ptVar6 = ptVar4 + 0x15;
        }
      } while (ptVar4 != ptVar1);
    }
    local_44[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_44,1);
  }
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x260;
  local_60.expr = "test_invoke_r_fun<conv_from<int>>(f(40), p0012_nothrows, p0012_nothrows, f, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_r_fun<conv_from<int>>(f(40), p0012_nothrows, p0012_nothrows, f, 40)";
    *(undefined4 *)&ptVar1[-1].file = 0x113004;
    *(undefined4 *)((long)&ptVar1[-1].file + 4) = 0;
    ptVar1[-1].line = 0x260;
    *(undefined4 *)&ptVar1[-1].field_0xc = local_60._12_4_;
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  local_44[0] = '.';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  local_34 = 0x28;
  test_invoke_r_fun<conv_from<int,true>,true,true,int(*const&)(int)noexcept,int>(local_44,&local_40)
  ;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  iVar2 = (*local_40)(0x28);
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x261;
  local_60.expr = "PP_UNIQUE(constexpr) == (eggs::invoke_r<conv_from<int>>(f, 40))";
  if (iVar2 != 0x2e) {
    test_report_info<void>::failures = test_report_info<void>::failures + 1;
    poVar3 = operator<<((ostream *)&std::cerr,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is false\n",10);
    ptVar1 = test_scope_stack<void>::stack.
             super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur !=
        test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      ptVar4 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pptVar5 = test_scope_stack<void>::stack.
                super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      ptVar6 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
        poVar3 = operator<<((ostream *)&std::cerr,ptVar4);
        local_44[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_44,1);
        ptVar4 = ptVar4 + 1;
        if (ptVar4 == ptVar6) {
          ptVar4 = pptVar5[1];
          pptVar5 = pptVar5 + 1;
          ptVar6 = ptVar4 + 0x15;
        }
      } while (ptVar4 != ptVar1);
    }
    local_44[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_44,1);
  }
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x262;
  local_60.expr = "test_invoke_r_fun<conv_from_throws<int>>(f(40), p0012_nothrows, throws, f, 40)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr =
         "test_invoke_r_fun<conv_from_throws<int>>(f(40), p0012_nothrows, throws, f, 40)";
    *(undefined4 *)&ptVar1[-1].file = 0x113004;
    *(undefined4 *)((long)&ptVar1[-1].file + 4) = 0;
    ptVar1[-1].line = 0x262;
    *(undefined4 *)&ptVar1[-1].field_0xc = local_60._12_4_;
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  local_44[0] = '.';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  local_34 = 0x28;
  test_invoke_r_fun<conv_from<int,false>,true,false,int(*const&)(int)noexcept,int>
            (local_44,&local_40);
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  iVar2 = (*local_40)(0x28);
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x263;
  local_60.expr = "PP_UNIQUE(constexpr) == (eggs::invoke_r<conv_from_throws<int>>(f, 40))";
  if (iVar2 != 0x2e) {
    test_report_info<void>::failures = test_report_info<void>::failures + 1;
    poVar3 = operator<<((ostream *)&std::cerr,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is false\n",10);
    ptVar1 = test_scope_stack<void>::stack.
             super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur !=
        test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      ptVar4 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pptVar5 = test_scope_stack<void>::stack.
                super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      ptVar6 = test_scope_stack<void>::stack.
               super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
        poVar3 = operator<<((ostream *)&std::cerr,ptVar4);
        local_44[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_44,1);
        ptVar4 = ptVar4 + 1;
        if (ptVar4 == ptVar6) {
          ptVar4 = pptVar5[1];
          pptVar5 = pptVar5 + 1;
          ptVar6 = ptVar4 + 0x15;
        }
      } while (ptVar4 != ptVar1);
    }
    local_44[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_44,1);
  }
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x265;
  local_60.expr = "test_not_invocable(f)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable(f)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x265);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  ptVar1 = test_scope_stack<void>::stack.
           super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_60.line = 0x266;
  local_60.expr = "test_not_invocable(f, 40, 41)";
  if (test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur ==
      test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
      _M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<test_context,std::allocator<test_context>>::_M_push_front_aux<test_context_const&>
              ((deque<test_context,std::allocator<test_context>> *)&test_scope_stack<void>::stack,
               &local_60);
  }
  else {
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur[-1].expr = "test_not_invocable(f, 40, 41)";
    ptVar1[-1].file =
         "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
    *(ulong *)&ptVar1[-1].line = CONCAT44(local_60._12_4_,0x266);
    test_scope_stack<void>::stack.super__Deque_base<test_context,_std::allocator<test_context>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur =
         test_scope_stack<void>::stack.
         super__Deque_base<test_context,_std::allocator<test_context>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur + -1;
  }
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  return;
}

Assistant:

void test_fun_obj()
{
    /* call-op */ {
        struct Fn
        {
            constexpr14 int operator()(int base) noexcept
            {
                return base + 0;
            }
        };
        auto f = Fn{};
        constexpr auto cf = Fn{};

        CHECK_SCOPE(test_invoke_fun(f(40), nothrows, f, 40));
        CHECK_CONSTEXPR14(eggs::invoke(f, 40));
        CHECK_SCOPE(test_not_invocable(cf, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(f)(40), nothrows, std::move(f), 40));
        CHECK_CONSTEXPR14(eggs::invoke(std::move(f), 40));
        CHECK_SCOPE(test_not_invocable(std::move(cf), 40));

        CHECK_SCOPE(test_not_invocable(f));
        CHECK_SCOPE(test_not_invocable(f, 40, 41));
        CHECK_SCOPE(test_not_invocable_r<int*>(f, 40));

        struct Fnc
        {
            constexpr int operator()(int base) const noexcept
            {
                return base + 1;
            }
        };
        auto fc = Fnc{};
        constexpr auto cfc = Fnc{};

        CHECK_SCOPE(test_invoke_fun(fc(40), nothrows, fc, 40));
        CHECK_CONSTEXPR(eggs::invoke(fc, 40));
        CHECK_SCOPE(test_invoke_fun(cfc(40), nothrows, cfc, 40));
        CHECK_CONSTEXPR(eggs::invoke(cfc, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fc)(40), nothrows, std::move(fc), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(fc), 40));
        CHECK_SCOPE(test_invoke_fun(std::move(cfc)(40), nothrows, std::move(cfc), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(cfc), 40));

        struct Fnl
        {
            constexpr14 int operator()(int base) & noexcept
            {
                return base + 2;
            }
        };
        auto fl = Fnl{};
        constexpr auto cfl = Fnl{};

        CHECK_SCOPE(test_invoke_fun(fl(40), nothrows, fl, 40));
        CHECK_CONSTEXPR14(eggs::invoke(fl, 40));
        CHECK_SCOPE(test_not_invocable(cfl, 40));
        CHECK_SCOPE(test_not_invocable(std::move(fl), 40));
        CHECK_SCOPE(test_not_invocable(std::move(cfl), 40));

        struct Fnr
        {
            constexpr14 int operator()(int base) && noexcept
            {
                return base + 3;
            }
        };
        auto fr = Fnr{};
        constexpr auto cfr = Fnr{};

        CHECK_SCOPE(test_not_invocable(fr, 40));
        CHECK_SCOPE(test_not_invocable(cfr, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fr)(40), nothrows, std::move(fr), 40));
        CHECK_CONSTEXPR14(eggs::invoke(std::move(fr), 40));
        CHECK_SCOPE(test_not_invocable(std::move(cfr), 40));

        struct Fncl
        {
            constexpr int operator()(int base) const& noexcept
            {
                return base + 4;
            }
        };
        auto fcl = Fncl{};
        constexpr auto cfcl = Fncl{};

        CHECK_SCOPE(test_invoke_fun(fcl(40), nothrows, fcl, 40));
        CHECK_CONSTEXPR(eggs::invoke(fcl, 40));
        CHECK_SCOPE(test_invoke_fun(cfcl(40), nothrows, cfcl, 40));
        CHECK_CONSTEXPR(eggs::invoke(cfcl, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fcl)(40), nothrows, std::move(fcl), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(fcl), 40));
        CHECK_SCOPE(test_invoke_fun(std::move(cfcl)(40), nothrows, std::move(cfcl), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(cfcl), 40));

        struct Fncr
        {
            constexpr int operator()(int base) const&& noexcept
            {
                return base + 5;
            }
        };
        auto fcr = Fncr{};
        constexpr auto cfcr = Fncr{};

        CHECK_SCOPE(test_not_invocable(fcr, 40));
        CHECK_SCOPE(test_not_invocable(cfcr, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fcr)(40), nothrows, std::move(fcr), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(fcr), 40));
        CHECK_SCOPE(test_invoke_fun(std::move(cfcr)(40), nothrows, std::move(cfcr), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(cfcr), 40));
    }

    /* fun-ptr */ {
        struct S
        {
            static constexpr int f(int base) noexcept(p0012)
            {
                return base + 6;
            }
        };
        constexpr auto f = &S::f;

        CHECK_SCOPE(test_invoke_fun(f(40), p0012_nothrows, f, 40));
        CHECK_CONSTEXPR(eggs::invoke(f, 40));

        CHECK_SCOPE(test_invoke_fun(f(conv_to<int>{40}), p0012_nothrows, f, conv_to<int>{40}));
        CHECK_CONSTEXPR(eggs::invoke(f, conv_to<int>{40}));
        CHECK_SCOPE(test_invoke_fun(f(conv_to_throws<int>{40}), throws, f, conv_to_throws<int>{40}));
        CHECK_CONSTEXPR(eggs::invoke(f, conv_to_throws<int>{40}));
        CHECK_SCOPE(test_invoke_r_fun<conv_from<int>>(f(40), p0012_nothrows, p0012_nothrows, f, 40));
        CHECK_CONSTEXPR(eggs::invoke_r<conv_from<int>>(f, 40));
        CHECK_SCOPE(test_invoke_r_fun<conv_from_throws<int>>(f(40), p0012_nothrows, throws, f, 40));
        CHECK_CONSTEXPR(eggs::invoke_r<conv_from_throws<int>>(f, 40));

        CHECK_SCOPE(test_not_invocable(f));
        CHECK_SCOPE(test_not_invocable(f, 40, 41));
    }
}